

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileParser::getVector2
          (ObjFileParser *this,
          vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *point2d_array)

{
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  aiVector2t<float> local_28;
  ai_real local_20;
  ai_real local_1c;
  ai_real y;
  ai_real x;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *point2d_array_local;
  ObjFileParser *this_local;
  
  _y = point2d_array;
  point2d_array_local = (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)this;
  copyNextWord(this,this->m_buffer,0x1000);
  local_1c = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_20 = fast_atof(this->m_buffer);
  this_00 = _y;
  aiVector2t<float>::aiVector2t(&local_28,local_1c,local_20);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back(this_00,&local_28);
  _Var1 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var1._M_current;
  return;
}

Assistant:

void ObjFileParser::getVector2( std::vector<aiVector2D> &point2d_array ) {
    ai_real x, y;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    point2d_array.push_back(aiVector2D(x, y));

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}